

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFloatExc.cpp
# Opt level: O1

void __thiscall Iex_3_2::MathExcOn::MathExcOn(MathExcOn *this,int when)

{
  int iVar1;
  
  this->_changed = false;
  iVar1 = fpExceptions();
  this->_saved = iVar1;
  if (iVar1 == when) {
    return;
  }
  this->_changed = true;
  setFpExceptions(when);
  setFpExceptionHandler(anon_unknown_10::fpeHandler);
  return;
}

Assistant:

MathExcOn::MathExcOn (int when) : _changed (false)
{
    _saved = getMathExcOn ();

    if (_saved != when)
    {
        _changed = true;
        mathExcOn (when);
    }
}